

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O3

void __thiscall
TasGrid::GridSequence::applyTransformationTransposed<1>(GridSequence *this,double *weights)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  pointer piVar4;
  _Bit_type *p_Var5;
  int iVar6;
  uint uVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  uint *puVar8;
  uint *puVar9;
  uint uVar10;
  _Bit_type *p_Var11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  pointer piVar16;
  GridSequence *this_00;
  size_type sVar17;
  ulong uVar18;
  double dVar19;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> level;
  Data2D<int> parents;
  allocator_type local_132;
  bool local_131;
  size_type local_130;
  GridSequence *local_128;
  MultiIndexSet *local_120;
  ulong local_118;
  size_type local_110;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  double *local_d8;
  ulong local_d0;
  pointer local_c8;
  pointer local_c0;
  ulong local_b8;
  ulong *local_b0;
  ulong *local_a8;
  pointer local_a0;
  vector<bool,_std::allocator<bool>_> local_98;
  vector<int,_std::allocator<int>_> local_70;
  Data2D<int> local_58;
  
  local_120 = &(this->super_BaseCanonicalGrid).points;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_120 = &(this->super_BaseCanonicalGrid).needed;
  }
  local_130 = (size_type)local_120->cache_num_indexes;
  local_128 = this;
  local_d8 = weights;
  MultiIndexManipulations::computeLevels(&local_70,local_120);
  puVar9 = (uint *)(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
  puVar8 = (uint *)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if (puVar9 != (uint *)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish &&
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar7 = *local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      uVar10 = *puVar9;
      uVar13 = uVar7;
      if ((int)uVar7 <= (int)uVar10) {
        uVar13 = uVar10;
      }
      if ((int)uVar7 < (int)uVar10) {
        puVar8 = puVar9;
      }
      puVar9 = puVar9 + 1;
      uVar7 = uVar13;
    } while (puVar9 != (uint *)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
  }
  uVar7 = *puVar8;
  MultiIndexManipulations::computeDAGup(&local_58,local_120);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_f0,(long)(int)uVar7 + 1U,(allocator_type *)&local_98);
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_108,(long)(int)uVar7 + 1U,(allocator_type *)&local_98);
  local_131 = false;
  ::std::vector<bool,_std::allocator<bool>_>::vector(&local_98,local_130,&local_131,&local_132);
  if (0 < (int)uVar7) {
    uVar15 = 0x800000000000003f;
    local_118 = 0x800000000000003f;
    this_00 = local_128;
    do {
      uVar10 = uVar7;
      if (0 < (int)local_130) {
        sVar17 = 0;
        local_d0 = (ulong)uVar7;
        do {
          uVar7 = local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
          p_Var5 = local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
          if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[sVar17] == (uint)local_d0) {
            local_c0 = (local_120->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + local_120->num_dimensions * sVar17;
            *local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start = 0;
            *local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start = (int)sVar17;
            p_Var11 = local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            local_110 = sVar17;
            if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p !=
                local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p) {
              memset(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                     (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              p_Var11 = p_Var5;
              this_00 = local_128;
              uVar15 = local_118;
            }
            piVar4 = local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (uVar7 != 0) {
              *p_Var11 = *p_Var11 & ~(0xffffffffffffffffU >> (-(char)uVar7 & 0x3fU));
            }
            uVar7 = (this_00->super_BaseCanonicalGrid).num_dimensions;
            sVar17 = local_110;
            if (*local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start < (int)uVar7) {
              local_a0 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              iVar6 = 0;
              local_a8 = local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              local_c8 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar16 = local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                iVar1 = piVar4[iVar6];
                if (iVar1 < (int)uVar7) {
                  iVar2 = local_a0[(long)piVar16[iVar6] * local_58.stride + (long)iVar1];
                  uVar12 = (ulong)iVar2;
                  if (uVar12 != 0xffffffffffffffff) {
                    iVar14 = iVar2 + 0x3f;
                    if (-1 < iVar2) {
                      iVar14 = iVar2;
                    }
                    uVar18 = (ulong)((uVar12 & uVar15) < 0x8000000000000001);
                    uVar3 = (local_a8 + (iVar14 >> 6))[uVar18 - 1];
                    if ((uVar3 >> (uVar12 & 0x3f) & 1) == 0) {
                      local_b8 = uVar3;
                      local_b0 = local_a8 + (iVar14 >> 6);
                      dVar19 = evalBasis(this_00,(local_120->indexes).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start +
                                                 uVar12 * local_120->num_dimensions,local_c0);
                      if (0 < (int)uVar7) {
                        uVar15 = 0;
                        do {
                          local_d8[(long)(int)(iVar2 * uVar7) + uVar15] =
                               local_d8[(long)(int)(iVar2 * uVar7) + uVar15] -
                               local_d8[(long)(int)(uVar7 * (int)local_110) + uVar15] * dVar19;
                          uVar15 = uVar15 + 1;
                        } while (uVar7 != uVar15);
                      }
                      local_b0[uVar18 - 1] = local_b8 | 1L << ((byte)iVar2 & 0x3f);
                      piVar4[(long)iVar6 + 1] = 0;
                      local_c8[(long)iVar6 + 1] = iVar2;
                      piVar16 = local_c8;
                      this_00 = local_128;
                      uVar15 = local_118;
                      sVar17 = local_110;
                      iVar6 = iVar6 + 1;
                      goto LAB_001ac78f;
                    }
                  }
                  piVar4[iVar6] = iVar1 + 1;
                }
                else {
                  piVar4[(long)iVar6 + -1] = piVar4[(long)iVar6 + -1] + 1;
                  iVar6 = iVar6 + -1;
                }
LAB_001ac78f:
                uVar7 = (this_00->super_BaseCanonicalGrid).num_dimensions;
              } while (*piVar4 < (int)uVar7);
            }
          }
          sVar17 = sVar17 + 1;
          uVar10 = (uint)local_d0;
        } while (sVar17 != local_130);
      }
      uVar7 = uVar10 - 1;
    } while (1 < (int)uVar10);
  }
  if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
  }
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((uint *)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (uint *)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridSequence::applyTransformationTransposed(double weights[]) const{
    // mode 0: applies the transposed linear operator for interpolation and quadrature.
    // mode 1: applies the transposed linear operator for differentiation.
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();

    std::vector<int> level = MultiIndexManipulations::computeLevels(work);
    int top_level = *std::max_element(level.begin(), level.end());

    Data2D<int> parents = MultiIndexManipulations::computeDAGup(work);

    std::vector<int> monkey_count(top_level + 1);
    std::vector<int> monkey_tail(top_level + 1);
    std::vector<bool> used(num_points);

    for(int l=top_level; l>0; l--){
        for(int i=0; i<num_points; i++){
            if (level[i] == l){
                const int* p = work.getIndex(i);
                int current = 0;

                monkey_count[0] = 0;
                monkey_tail[0] = i;
                std::fill(used.begin(), used.end(), false);

                while(monkey_count[0] < num_dimensions){
                    if (monkey_count[current] < num_dimensions){
                        int branch = parents.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            if (mode == 0) {
                                weights[branch] -= weights[i] * evalBasis(work.getIndex(branch), p);
                            } else {
                                double weight_mult = evalBasis(work.getIndex(branch), p);
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -= weights[i * num_dimensions + d] * weight_mult;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}